

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O2

void tnt_schema_space_free(mh_assoc_t *schema)

{
  tnt_schema_sval *val;
  uint uVar1;
  mh_int_t mVar2;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *arg;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  assoc_val *ptr;
  assoc_val *ptr_00;
  mh_int_t i;
  uint uVar3;
  uint uVar4;
  undefined1 local_40 [8];
  assoc_key key_number;
  
  uVar1 = schema->n_buckets;
  for (uVar3 = 0;
      (uVar4 = uVar1, uVar1 != uVar3 &&
      (in_RDX = (void *)(ulong)(uVar3 & 0xf), uVar4 = uVar3,
      (schema->b[uVar3 >> 4] >> (uVar3 & 0xf) & 1) == 0)); uVar3 = uVar3 + 1) {
  }
  do {
    do {
      if (uVar1 <= uVar4) {
        return;
      }
      val = (tnt_schema_sval *)schema->p[uVar4]->data;
      local_40 = (undefined1  [8])&val->number;
      key_number.id._0_4_ = 4;
      mVar2 = mh_assoc_find(schema,(assoc_key *)local_40,in_RDX);
      if (mVar2 == schema->n_buckets) {
        ptr = (assoc_val *)0x0;
        arg = extraout_RDX;
      }
      else {
        ptr = schema->p[(long)(ulong)mVar2];
        mh_assoc_del(schema,mVar2,(void *)(ulong)mVar2);
        arg = extraout_RDX_00;
      }
      local_40 = (undefined1  [8])val->name;
      key_number.id._0_4_ = val->name_len;
      mVar2 = mh_assoc_find(schema,(assoc_key *)local_40,arg);
      if (mVar2 == schema->n_buckets) {
        ptr_00 = (assoc_val *)0x0;
      }
      else {
        ptr_00 = schema->p[(long)(ulong)mVar2];
        mh_assoc_del(schema,mVar2,(void *)(ulong)mVar2);
      }
      tnt_schema_sval_free(val);
      in_RDX = extraout_RDX_01;
      if (ptr != (assoc_val *)0x0) {
        tnt_mem_free(ptr);
        in_RDX = extraout_RDX_02;
      }
      if (ptr_00 != (assoc_val *)0x0) {
        tnt_mem_free(ptr_00);
        in_RDX = extraout_RDX_03;
      }
      uVar1 = schema->n_buckets;
      uVar3 = uVar4;
    } while (uVar1 <= uVar4);
    do {
      uVar3 = uVar3 + 1;
      uVar4 = uVar1;
      if (uVar1 <= uVar3) break;
      in_RDX = (void *)(ulong)(uVar3 & 0xf);
      uVar4 = uVar3;
    } while ((schema->b[uVar3 >> 4] >> (uVar3 & 0xf) & 1) == 0);
  } while( true );
}

Assistant:

static inline void
tnt_schema_space_free(struct mh_assoc_t *schema) {
	mh_int_t pos = 0;
	mh_int_t space_slot = 0;
	mh_foreach(schema, pos) {
		struct tnt_schema_sval *sval = NULL;
		sval = (*mh_assoc_node(schema, pos))->data;
		struct assoc_val *av1 = NULL, *av2 = NULL;
		do {
			struct assoc_key key_number = {
				(void *)&(sval->number),
				sizeof(uint32_t)
			};
			space_slot = mh_assoc_find(schema, &key_number, NULL);
			if (space_slot == mh_end(schema))
				break;
			av1 = *mh_assoc_node(schema, space_slot);
			mh_assoc_del(schema, space_slot, NULL);
		} while (0);
		do {
			struct assoc_key key_string = {
				sval->name,
				sval->name_len
			};
			space_slot = mh_assoc_find(schema, &key_string, NULL);
			if (space_slot == mh_end(schema))
				break;
			av2 = *mh_assoc_node(schema, space_slot);
			mh_assoc_del(schema, space_slot, NULL);
		} while (0);
		tnt_schema_sval_free(sval);
		if (av1) tnt_mem_free((void *)av1);
		if (av2) tnt_mem_free((void *)av2);
	}
}